

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

void __thiscall remote::Module::CacheSymbolData64(Module *this,void *buffer)

{
  int iVar1;
  Elf64_Word EVar2;
  ostream *poVar3;
  Elf64_Phdr *pEVar4;
  Elf64_Shdr *pEVar5;
  Elf64_Shdr *pEVar6;
  Elf64_Shdr *sec;
  size_t i_1;
  size_t sectionCount;
  string local_50 [8];
  string attrString;
  Elf64_Phdr *prog;
  size_t i;
  size_t programCount;
  void *buffer_local;
  Module *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"CacheSymbolData64");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pEVar4 = (Elf64_Phdr *)elf::arch64::GetProgramHeaderEntryCount(buffer);
  for (prog = (Elf64_Phdr *)0x0; prog < pEVar4; prog = (Elf64_Phdr *)((long)&prog->p_type + 1)) {
    attrString.field_2._8_8_ = elf::arch64::GetProgramHeaderEntry(buffer,(size_t)prog);
    if ((Elf64_Phdr *)attrString.field_2._8_8_ != (Elf64_Phdr *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Prog: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(attrString.field_2._8_8_ + 8));
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,*(ulong *)(attrString.field_2._8_8_ + 0x18));
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,*(ulong *)(attrString.field_2._8_8_ + 0x10));
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)attrString.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)(attrString.field_2._8_8_ + 4));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar1 = *(int *)attrString.field_2._8_8_;
      if (iVar1 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_NULL]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_LOAD]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_DYNAMIC]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 3) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_INTERP]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 4) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_NOTE]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 5) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_SHLIB]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 6) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_PHDR]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 7) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_TLS]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x60000000) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_LOOS]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x6474e550) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_GNU_EH_FRAME]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x6474e551) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_GNU_STACK]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x6474e552) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_GNU_RELRO]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x6fffffff) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_HIOS]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x70000000) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_LOPROC]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (iVar1 == 0x7fffffff) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[PT_HIPROC]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"[Default]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::string(local_50);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::append((char *)local_50);
      poVar3 = std::operator<<((ostream *)&std::cout,local_50);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_50);
    }
  }
  pEVar5 = (Elf64_Shdr *)elf::arch64::GetSectionHeaderEntryCount(buffer);
  poVar3 = std::operator<<((ostream *)&std::cout,"Section Count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)pEVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (sec = (Elf64_Shdr *)0x0; sec < pEVar5; sec = (Elf64_Shdr *)((long)&sec->sh_name + 1)) {
    pEVar6 = elf::arch64::GetSectionHeaderEntry(buffer,(size_t)sec);
    if (pEVar6 != (Elf64_Shdr *)0x0) {
      EVar2 = pEVar6->sh_type;
      if (EVar2 == 2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Section [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)sec);
        poVar3 = std::operator<<(poVar3,"]: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_offset);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_addr);
        poVar3 = std::operator<<(poVar3," - SYMTAB (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_type);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (EVar2 == 3) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Section [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)sec);
        poVar3 = std::operator<<(poVar3,"]: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_offset);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_addr);
        poVar3 = std::operator<<(poVar3," - STRTAB (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_type);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if (EVar2 == 9) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Section [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)sec);
        poVar3 = std::operator<<(poVar3,"]: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_offset);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_addr);
        poVar3 = std::operator<<(poVar3," - REL (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar6->sh_type);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void remote::Module::CacheSymbolData64(void* buffer) {
    std::cout << "CacheSymbolData64" << std::endl;

    size_t programCount = elf::arch64::GetProgramHeaderEntryCount(buffer);

    for(size_t i = 0; i < programCount; ++i) {
        Elf64_Phdr *prog = elf::arch64::GetProgramHeaderEntry(buffer, i);

        if (!prog)
            continue;

        std::cout << "Prog: " << std::hex << prog->p_offset << ":" << prog->p_paddr << ":" << prog->p_vaddr << ":" << prog->p_type << ":" << prog->p_flags << std::endl;

        switch (prog->p_type) {
            case PT_NULL:
                std::cout << "[PT_NULL]" << std::endl;
                break;
            case PT_LOAD:
                std::cout << "[PT_LOAD]" << std::endl;
                break;
            case PT_DYNAMIC:
                std::cout << "[PT_DYNAMIC]" << std::endl;
                break;
            case PT_INTERP:
                std::cout << "[PT_INTERP]" << std::endl;
                break;
            case PT_NOTE:
                std::cout << "[PT_NOTE]" << std::endl;
                break;
            case PT_SHLIB:
                std::cout << "[PT_SHLIB]" << std::endl;
                break;
            case PT_PHDR:
                std::cout << "[PT_PHDR]" << std::endl;
                break;
            case PT_TLS:
                std::cout << "[PT_TLS]" << std::endl;
                break;
            case PT_LOOS:
                std::cout << "[PT_LOOS]" << std::endl;
                break;
            case PT_HIOS:
                std::cout << "[PT_HIOS]" << std::endl;
                break;
            case PT_LOPROC:
                std::cout << "[PT_LOPROC]" << std::endl;
                break;
            case PT_HIPROC:
                std::cout << "[PT_HIPROC]" << std::endl;
                break;
            case PT_GNU_EH_FRAME:
                std::cout << "[PT_GNU_EH_FRAME]" << std::endl;
                break;
            case PT_GNU_STACK:
                std::cout << "[PT_GNU_STACK]" << std::endl;
                break;
            case PT_GNU_RELRO:
                std::cout << "[PT_GNU_RELRO]" << std::endl;
                break;
            default:
                std::cout << "[Default]" << std::endl;
                break;
        }

        std::string attrString;

        attrString.append((prog->p_flags & PF_R) ? "r" : "-");
        attrString.append((prog->p_flags & PF_W) ? "w" : "-");
        attrString.append((prog->p_flags & PF_X) ? "x" : "-");

        std::cout << attrString << std::endl;
    }

    size_t sectionCount = elf::arch64::GetSectionHeaderEntryCount(buffer);

    std::cout << "Section Count: " << sectionCount << std::endl;

    for(size_t i = 0; i < sectionCount; i++) {
        Elf64_Shdr* sec = elf::arch64::GetSectionHeaderEntry(buffer, i);

        if(!sec)
            continue;

        switch(sec->sh_type) {
            case SHT_SYMTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - SYMTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_STRTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - STRTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_REL:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - REL (" << sec->sh_type << ")" << std::endl;
                break;
        }

        /*
        const char* name = elf::arch64::GetNameOfSectionAtIndex(buffer, sec);

        if(!name)
            continue;

        std::cout << "Section: " << name << std::endl;*/
    }
}